

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bones.c
# Opt level: O0

void savebones(obj *corpse)

{
  long lVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  char cVar5;
  xchar levnum;
  int iVar6;
  obj *cont;
  monst *pmVar7;
  char *pcVar8;
  size_t sVar9;
  undefined1 local_2124;
  obj *otmp;
  memfile mf;
  char bonesid [10];
  char whynot [256];
  fruit *pfStack_40;
  char c;
  fruit *f;
  permonst *mptr;
  monst *mtmp;
  trap *ttmp;
  int local_18;
  int y;
  int x;
  int fd;
  obj *corpse_local;
  
  mnew((memfile *)&otmp,(memfile *)0x0);
  clear_bypasses();
  make_bones_id((char *)((long)mf.tags + 0x1f86),&u.uz);
  iVar6 = open_bonesfile((char *)((long)mf.tags + 0x1f86));
  if (-1 < iVar6) {
    close(iVar6);
    if (flags.debug == '\0') {
      return;
    }
    cVar5 = yn_function("Bones file already exists.  Replace it?","yn",'n');
    if (cVar5 != 'y') {
      return;
    }
    iVar6 = delete_bonesfile((char *)((long)mf.tags + 0x1f86));
    if (iVar6 == 0) {
      pline("Cannot unlink old bones.");
      return;
    }
  }
  unleash_all();
  for (mptr = (permonst *)level->monlist; mptr != (permonst *)0x0; mptr = (permonst *)mptr->mname) {
    iVar6._0_2_ = mptr->pxtyp;
    iVar6._2_1_ = mptr->msound;
    iVar6._3_1_ = mptr->msize;
    if ((0 < iVar6) &&
       (((((lVar1 = *(long *)&mptr->mlet, ((uint)mptr[1].mattk[4] >> 0x1d & 1) != 0 ||
           (lVar1 == 0x3c4850)) || (*(char *)(lVar1 + 0x2e) == ' ')) ||
         ((*(char *)(lVar1 + 0x2e) == '\x1f' || (lVar1 == 0x3c3910)))) || (lVar1 == 0x3c4f50)))) {
      mongone((monst *)mptr);
    }
  }
  if (u.usteed != (monst *)0x0) {
    dismount_steed(5);
  }
  dmonsfree(level);
  for (pfStack_40 = ffruit; pfStack_40 != (fruit *)0x0; pfStack_40 = pfStack_40->nextf) {
    pfStack_40->fid = -pfStack_40->fid;
  }
  if (uball != (obj *)0x0) {
    uball->owornmask = uball->owornmask & 0xffdfffff;
    uchain->owornmask = uchain->owornmask & 0xffbfffff;
  }
  if (((uarm != (obj *)0x0) &&
      (((0x5e < uarm->otyp && (uarm->otyp < 0x6a)) || ((0x53 < uarm->otyp && (uarm->otyp < 0x5f)))))
      ) && ((obj_descr[objects[uarm->otyp].oc_descr_idx].oc_descr != (char *)0x0 &&
            (iVar6 = strncmp(obj_descr[objects[uarm->otyp].oc_descr_idx].oc_descr,"gold ",5),
            iVar6 == 0)))) {
    end_burn(uarm,'\0');
  }
  if (u.ugrave_arise == -2) {
    cont = mk_named_object(0x215,mons + u.umonnum,(int)u.ux,(int)u.uy,plname);
    drop_upon_death((monst *)0x0,cont);
    if (cont == (obj *)0x0) {
      return;
    }
    mptr = (permonst *)0x0;
  }
  else if (urace.malenum == 0xe8) {
    drop_upon_death((monst *)0x0,(obj *)0x0);
    mptr = (permonst *)0x0;
    u.ugrave_arise = -1;
  }
  else if (u.ugrave_arise < 0) {
    drop_upon_death((monst *)0x0,(obj *)0x0);
    in_mklev = '\x01';
    pmVar7 = makemon(mons + 0x12a,level,(int)u.ux,(int)u.uy,0x20);
    in_mklev = '\0';
    if (pmVar7 == (monst *)0x0) {
      in_mklev = '\0';
      return;
    }
    mptr = (permonst *)christen_monst(pmVar7,plname);
    if (corpse != (obj *)0x0) {
      obj_attach_mid(corpse,((monst *)mptr)->m_id);
    }
  }
  else {
    in_mklev = '\x01';
    pmVar7 = makemon(mons + u.ugrave_arise,level,(int)u.ux,(int)u.uy,0);
    in_mklev = '\0';
    if (pmVar7 == (monst *)0x0) {
      drop_upon_death((monst *)0x0,(obj *)0x0);
      return;
    }
    mptr = (permonst *)christen_monst(pmVar7,plname);
    newsym((int)u.ux,(int)u.uy);
    pcVar8 = mons_mname(mons + u.ugrave_arise);
    pcVar8 = an(pcVar8);
    pline("Your body rises from the dead as %s...",pcVar8);
    (*windowprocs.win_pause)(P_MESSAGE);
    drop_upon_death((monst *)mptr,(obj *)0x0);
    m_dowear(level,(monst *)mptr,'\x01');
  }
  if (mptr != (permonst *)0x0) {
    if (u.ulevel == 0) {
      local_2124 = 1;
    }
    else {
      local_2124 = (undefined1)u.ulevel;
    }
    *(undefined1 *)&mptr[1].geno = local_2124;
    iVar6 = u.uhpmax;
    mptr->mflags1 = u.uhpmax;
    iVar4 = u.uhpmax;
    u.uhpmax._0_2_ = (undefined2)iVar6;
    u.uhpmax._2_1_ = SUB41(iVar6,2);
    uVar2 = u.uhpmax._2_1_;
    u.uhpmax._3_1_ = SUB41(iVar6,3);
    uVar3 = u.uhpmax._3_1_;
    mptr->pxtyp = (undefined2)u.uhpmax;
    u.uhpmax = iVar4;
    mptr->msound = uVar2;
    mptr->msize = uVar3;
    mptr[1].mattk[4] = (attack)((uint)mptr[1].mattk[4] & 0xfffffffe | (int)flags.female & 1U);
    mptr[1].mattk[4] = (attack)((uint)mptr[1].mattk[4] & 0xfff7ffff | 0x80000);
  }
  for (mptr = (permonst *)level->monlist; mptr != (permonst *)0x0; mptr = (permonst *)mptr->mname) {
    resetobjs(*(obj **)(mptr->mattk + 2),'\0');
    *(undefined4 *)&mptr->mcolor = 0;
    if (mptr[1].mattk[2].aatyp != '\0') {
      mptr[1].mattk[4] = (attack)((uint)mptr[1].mattk[4] & 0xffbfffff);
      mptr[1].mattk[2].aatyp = '\0';
    }
  }
  for (mtmp = (monst *)level->lev_traps; mtmp != (monst *)0x0; mtmp = mtmp->nmon) {
    *(byte *)&mtmp->data = *(byte *)&mtmp->data & 0x7f;
    *(byte *)&mtmp->data = *(byte *)&mtmp->data & 0xdf | (((ulong)mtmp->data & 0x1f) == 0xd) << 5;
  }
  resetobjs(level->objlist,'\0');
  resetobjs(level->buriedobjlist,'\0');
  u.uy = '\0';
  u.ux = '\0';
  for (local_18 = 0; local_18 < 0x50; local_18 = local_18 + 1) {
    for (ttmp._4_4_ = 0; ttmp._4_4_ < 0x15; ttmp._4_4_ = ttmp._4_4_ + 1) {
      level->locations[local_18][ttmp._4_4_].seenv = '\0';
      *(uint *)&level->locations[local_18][ttmp._4_4_].field_0x6 =
           *(uint *)&level->locations[local_18][ttmp._4_4_].field_0x6 & 0xfffff7ff;
      clear_memory_glyph((schar)local_18,(schar)ttmp._4_4_,0);
    }
  }
  iVar6 = create_bonesfile((char *)((long)mf.tags + 0x1f86),bonesid + 2);
  if (iVar6 < 0) {
    if (flags.debug != '\0') {
      pline("%s",bonesid + 2);
    }
    paniclog("savebones",bonesid + 2);
  }
  else {
    sVar9 = strlen((char *)((long)mf.tags + 0x1f86));
    whynot[0xff] = (char)sVar9 + '\x01';
    store_version((memfile *)&otmp);
    mwrite((memfile *)&otmp,whynot + 0xff,1);
    mwrite((memfile *)&otmp,(void *)((long)mf.tags + 0x1f86),(int)whynot[0xff]);
    savefruitchn((memfile *)&otmp);
    update_mlstmv();
    levnum = ledger_no(&u.uz);
    savelev((memfile *)&otmp,levnum);
    store_mf(iVar6,(memfile *)&otmp);
    close(iVar6);
    commit_bonesfile((char *)((long)mf.tags + 0x1f86));
  }
  return;
}

Assistant:

void savebones(struct obj *corpse)
{
	int fd, x, y;
	struct trap *ttmp;
	struct monst *mtmp;
	const struct permonst *mptr;
	struct fruit *f;
	char c, whynot[BUFSZ], bonesid[10];
	struct memfile mf;

	mnew(&mf, NULL);

	/* caller has already checked `can_make_bones()' */

	clear_bypasses();
	make_bones_id(bonesid, &u.uz);
	fd = open_bonesfile(bonesid);
	if (fd >= 0) {
		close(fd);
		if (wizard) {
		    if (yn("Bones file already exists.  Replace it?") == 'y') {
			if (delete_bonesfile(bonesid)) goto make_bones;
			else pline("Cannot unlink old bones.");
		    }
		}
		return;
	}

make_bones:
	unleash_all();
	/* in case these characters are not in their home bases */
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (DEADMONSTER(mtmp)) continue;
	    mptr = mtmp->data;
	    if (mtmp->iswiz || mptr == &mons[PM_MEDUSA] ||
		    mptr->msound == MS_NEMESIS || mptr->msound == MS_LEADER ||
		    mptr == &mons[PM_VLAD_THE_IMPALER] ||
		    mptr == &mons[PM_CTHULHU])
		mongone(mtmp);
	}
	if (u.usteed) dismount_steed(DISMOUNT_BONES);
		dmonsfree(level);	/* discard dead or gone monsters */

	/* mark all fruits as nonexistent; when we come to them we'll mark
	 * them as existing (using goodfruit())
	 */
	for (f=ffruit; f; f=f->nextf) f->fid = -f->fid;

	/* check iron balls separately--maybe they're not carrying it */
	if (uball) {
		uball->owornmask &= ~W_BALL;
		uchain->owornmask &= ~W_CHAIN;
	}

	/* extinguish armor */
	if (uarm && Is_gold_dragon_armor(uarm->otyp))
	    end_burn(uarm, FALSE);

	/* dispose of your possessions, usually cursed */
	if (u.ugrave_arise == (NON_PM - 1)) {
		struct obj *otmp;

		/* embed your possessions in your statue */
		otmp = mk_named_object(STATUE, &mons[u.umonnum],
				       u.ux, u.uy, plname);

		drop_upon_death(NULL, otmp);
		if (!otmp) return;	/* couldn't make statue */
		mtmp = NULL;
	} else if (Race_if(PM_VAMPIRE)) {
		/* don't let vampires rise as some other monster */
		drop_upon_death(NULL, NULL);
		mtmp = NULL;
		u.ugrave_arise = NON_PM;
	} else if (u.ugrave_arise < LOW_PM) {
		/* drop everything */
		drop_upon_death(NULL, NULL);
		/* trick makemon() into allowing monster creation
		 * on your location
		 */
		in_mklev = TRUE;
		mtmp = makemon(&mons[PM_GHOST], level, u.ux, u.uy, MM_NONAME);
		in_mklev = FALSE;
		if (!mtmp) return;
		mtmp = christen_monst(mtmp, plname);
		if (corpse)
			obj_attach_mid(corpse, mtmp->m_id); 
	} else {
		/* give your possessions to the monster you become */
		in_mklev = TRUE;
		mtmp = makemon(&mons[u.ugrave_arise], level, u.ux, u.uy, NO_MM_FLAGS);
		in_mklev = FALSE;
		if (!mtmp) {
			drop_upon_death(NULL, NULL);
			return;
		}
		mtmp = christen_monst(mtmp, plname);
		newsym(u.ux, u.uy);
		pline("Your body rises from the dead as %s...",
			an(mons_mname(&mons[u.ugrave_arise])));
		win_pause_output(P_MESSAGE);
		drop_upon_death(mtmp, NULL);
		m_dowear(level, mtmp, TRUE);
	}
	if (mtmp) {
		mtmp->m_lev = (u.ulevel ? u.ulevel : 1);
		mtmp->mhp = mtmp->mhpmax = u.uhpmax;
		mtmp->female = flags.female;
		mtmp->msleeping = 1;
	}
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
		resetobjs(mtmp->minvent,FALSE);
		/* do not zero out m_ids for bones levels any more */
		mtmp->mlstmv = 0L;
		if (mtmp->mtame) mtmp->mtame = mtmp->mpeaceful = 0;
	}
	for (ttmp = level->lev_traps; ttmp; ttmp = ttmp->ntrap) {
		ttmp->madeby_u = 0;
		ttmp->tseen = (ttmp->ttyp == HOLE);
	}
	resetobjs(level->objlist,FALSE);
	resetobjs(level->buriedobjlist, FALSE);

	/* Hero is no longer on the map. */
	u.ux = u.uy = 0;

	/* Clear all memory from the level. */
	for (x=0; x<COLNO; x++) for(y=0; y<ROWNO; y++) {
	    level->locations[x][y].seenv = 0;
	    level->locations[x][y].waslit = 0;
	    clear_memory_glyph(x, y, S_unexplored);
	}

	fd = create_bonesfile(bonesid, whynot);
	if (fd < 0) {
		if (wizard)
			pline("%s", whynot);

		/* bones file creation problems are silent to the player.
		 * Keep it that way, but place a clue into the paniclog.
		 */
		paniclog("savebones", whynot);
		return;
	}
	c = (char) (strlen(bonesid) + 1);

	store_version(&mf);
	/* No tagging is useful here, as the tags in bones memfiles
	 * aren't used for anything anyway.
	 */
	mwrite(&mf, &c, sizeof c);
	mwrite(&mf, bonesid, (unsigned) c);	/* DD.nnn */
	savefruitchn(&mf);
	update_mlstmv();	/* update monsters for eventual restoration */
	savelev(&mf, ledger_no(&u.uz));
	
	store_mf(fd, &mf);	/* also frees mf */
	
	close(fd);
	commit_bonesfile(bonesid);
}